

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O3

void test_evp_value_init(void)

{
  size_type *psVar1;
  size_type *psVar2;
  int iVar3;
  size_type *local_80;
  opt_t o_;
  opt_t o1;
  long local_38;
  undefined1 local_30 [16];
  
  psVar1 = &o_.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  o_.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus._M_p = (pointer)0x0;
  o_.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._0_1_ = 0;
  local_80 = psVar1;
  o1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&o1.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2 + 8),"one","");
  psVar2 = &o1.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  o_.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ = psVar2;
  if ((undefined1 *)
      o1.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_.field_2._8_8_ != local_30) {
    o_.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ =
         o1.
         super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .super_type.value_.field_2._8_8_;
  }
  local_30[0] = 0;
  if (o_.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_._M_dataplus._M_p != (pointer)0x0) {
    o1.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ = local_30;
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa7,"void test_evp_value_init()");
  }
  if (local_38 == 0) {
    o1.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ = local_30;
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa8,"void test_evp_value_init()");
  }
  o1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ = local_30;
  iVar3 = std::__cxx11::string::compare
                    (o_.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2._M_local_buf + 8);
  if (iVar3 != 0) {
    __assert_fail("o1.value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xab,"void test_evp_value_init()");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar3 != 0) {
    __assert_fail("o_.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xad,"void test_evp_value_init()");
  }
  iVar3 = std::__cxx11::string::compare
                    (o_.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2._M_local_buf + 8);
  if (iVar3 != 0) {
    __assert_fail("o1.unsafe_raw_value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xae,"void test_evp_value_init()");
  }
  iVar3 = std::__cxx11::string::compare
                    (o1.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2._M_local_buf + 8);
  if (iVar3 != 0) {
    __assert_fail("oE.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xaf,"void test_evp_value_init()");
  }
  if ((undefined1 *)
      o1.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_.field_2._8_8_ != local_30) {
    operator_delete((void *)o1.
                            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .super_type.value_.field_2._8_8_);
  }
  if ((size_type *)
      o_.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_.field_2._8_8_ != psVar2) {
    operator_delete((void *)o_.
                            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .super_type.value_.field_2._8_8_);
  }
  if (local_80 != psVar1) {
    operator_delete(local_80);
  }
  return;
}

Assistant:

void test_evp_value_init()
{
  {
    typedef compact_optional<evp_value_init<int>> opt_t;
    opt_t o_, o1 (1), oE(0);
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == 1);
    
    assert (o_.unsafe_raw_value() == 0);
    assert (o1.unsafe_raw_value() == 1);
    assert (oE.unsafe_raw_value() == 0);
  }
  {
    typedef compact_optional<evp_value_init<std::string>> opt_t;
    opt_t o_, o1 (std::string("one")), oE ((std::string()));
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == "one");
    
    assert (o_.unsafe_raw_value() == "");
    assert (o1.unsafe_raw_value() == "one");
    assert (oE.unsafe_raw_value() == "");
  }
}